

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::
ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
          (EpsCopyInputStream *this,char *ptr,anon_class_32_4_91646d40 add)

{
  byte bVar1;
  char *pcVar2;
  LogMessage *pLVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  pair<const_char_*,_int> pVar9;
  LogFinisher local_69;
  LogMessage local_68;
  
  bVar1 = *ptr;
  uVar6 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar9 = ReadSizeFallback(ptr,(uint)bVar1);
    pcVar2 = pVar9.first;
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    uVar6 = pVar9.second;
  }
  else {
    pcVar2 = ptr + 1;
  }
  pcVar5 = this->buffer_end_;
  iVar8 = (int)pcVar5 - (int)pcVar2;
  if (iVar8 < (int)uVar6) {
    do {
      pcVar2 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                         (pcVar2,pcVar5,add);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      uVar7 = (int)pcVar2 - (int)this->buffer_end_;
      if (0x10 < uVar7) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                   ,0x2f2);
        pLVar3 = LogMessage::operator<<
                           (&local_68,"CHECK failed: overrun >= 0 && overrun <= kSlopBytes: ");
        LogFinisher::operator=(&local_69,pLVar3);
        LogMessage::~LogMessage(&local_68);
      }
      if ((int)(uVar6 - iVar8) < 0x11) {
        local_68.line_ = 0;
        local_68._20_4_ = 0;
        local_68.message_._M_dataplus._M_p._0_2_ = 0;
        local_68._0_8_ = *(undefined8 *)this->buffer_end_;
        local_68.filename_ = *(char **)(this->buffer_end_ + 8);
        pcVar2 = (char *)((long)&local_68.level_ + (long)(int)(uVar6 - iVar8));
        pcVar5 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                           ((char *)((long)&local_68.level_ + (long)(int)uVar7),pcVar2,add);
        if (pcVar5 != pcVar2) {
          return (char *)0x0;
        }
        return this->buffer_end_ + ((long)pcVar5 - (long)&local_68);
      }
      uVar6 = uVar6 - (iVar8 + uVar7);
      if ((int)uVar6 < 1) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                   ,0x300);
        pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: (size) > (0): ");
        LogFinisher::operator=(&local_69,pLVar3);
        LogMessage::~LogMessage(&local_68);
      }
      if (this->limit_ < 0x11) {
        return (char *)0x0;
      }
      pcVar2 = Next(this);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar2 = pcVar2 + (int)uVar7;
      pcVar5 = this->buffer_end_;
      iVar8 = (int)pcVar5 - (int)pcVar2;
    } while (iVar8 < (int)uVar6);
  }
  pcVar4 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                     (pcVar2,pcVar2 + (int)uVar6,add);
  pcVar5 = (char *)0x0;
  if (pcVar2 + (int)uVar6 == pcVar4) {
    pcVar5 = pcVar4;
  }
  return pcVar5;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedVarint(const char* ptr, Add add) {
  int size = ReadSize(&ptr);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int chunk_size = buffer_end_ - ptr;
  while (size > chunk_size) {
    ptr = ReadPackedVarintArray(ptr, buffer_end_, add);
    if (ptr == nullptr) return nullptr;
    int overrun = ptr - buffer_end_;
    GOOGLE_DCHECK(overrun >= 0 && overrun <= kSlopBytes);
    if (size - chunk_size <= kSlopBytes) {
      // The current buffer contains all the information needed, we don't need
      // to flip buffers. However we must parse from a buffer with enough space
      // so we are not prone to a buffer overflow.
      char buf[kSlopBytes + 10] = {};
      std::memcpy(buf, buffer_end_, kSlopBytes);
      GOOGLE_CHECK_LE(size - chunk_size, kSlopBytes);
      auto end = buf + (size - chunk_size);
      auto res = ReadPackedVarintArray(buf + overrun, end, add);
      if (res == nullptr || res != end) return nullptr;
      return buffer_end_ + (res - buf);
    }
    size -= overrun + chunk_size;
    GOOGLE_DCHECK_GT(size, 0);
    // We must flip buffers
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += overrun;
    chunk_size = buffer_end_ - ptr;
  }
  auto end = ptr + size;
  ptr = ReadPackedVarintArray(ptr, end, add);
  return end == ptr ? ptr : nullptr;
}